

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

IceTFloat * icetImageGetColorcf(IceTImage image)

{
  if ((image.opaque_internals != (IceTVoid *)0x0) &&
     (*(int *)((long)image.opaque_internals + 4) == 0xc002)) {
    return (IceTFloat *)((long)image.opaque_internals + 0x1c);
  }
  icetRaiseDiagnostic("Color format is not of type float.",0xfffffffb,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,0x2ae);
  return (IceTFloat *)0x0;
}

Assistant:

const IceTFloat *icetImageGetColorcf(const IceTImage image)
{
    IceTEnum color_format = icetImageGetColorFormat(image);

    if (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT) {
        icetRaiseError("Color format is not of type float.",
                       ICET_INVALID_OPERATION);
        return NULL;
    }

    return icetImageGetColorConstVoid(image, NULL);
}